

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

bool __thiscall
libmatroska::KaxBlockBlob::AddFrameAuto
          (KaxBlockBlob *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          LacingType lacing,KaxBlockBlob *PastBlock,KaxBlockBlob *ForwBlock)

{
  bool bVar1;
  KaxBlockGroup *this_00;
  KaxInternalBlock *pKVar2;
  
  if ((this->SimpleBlockMode == BLOCK_BLOB_ALWAYS_SIMPLE) ||
     (((ForwBlock == (KaxBlockBlob *)0x0 && (PastBlock == (KaxBlockBlob *)0x0)) &&
      (this->SimpleBlockMode == BLOCK_BLOB_SIMPLE_AUTO)))) {
    if (this->bUseSimpleBlock == false) {
      __assert_fail("bUseSimpleBlock == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x3dc,
                    "bool libmatroska::KaxBlockBlob::AddFrameAuto(const KaxTrackEntry &, uint64, DataBuffer &, LacingType, const KaxBlockBlob *, const KaxBlockBlob *)"
                   );
    }
    this_00 = (this->Block).group;
    if (this_00 == (KaxBlockGroup *)0x0) {
      this_00 = (KaxBlockGroup *)operator_new(0xa0);
      libebml::EbmlBinary::EbmlBinary((EbmlBinary *)this_00);
      *(undefined1 *)
       ((long)&(this_00->super_EbmlMaster).Checksum.super_EbmlBinary.super_EbmlElement.SizeLength +
       2) = 0;
      (this_00->super_EbmlMaster).ElementList.
      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->super_EbmlMaster).ElementList.
      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->super_EbmlMaster).Context = (EbmlSemanticContext *)0x0;
      *(undefined8 *)&(this_00->super_EbmlMaster).bChecksumUsed = 0;
      (this_00->super_EbmlMaster).Checksum.super_EbmlBinary.super_EbmlElement._vptr_EbmlElement =
           (_func_int **)0x0;
      (this_00->super_EbmlMaster).Checksum.super_EbmlBinary.super_EbmlElement.Size = 0;
      *(undefined4 *)
       &(this_00->super_EbmlMaster).Checksum.super_EbmlBinary.super_EbmlElement.ElementPosition = 4;
      *(undefined1 *)
       ((long)&(this_00->super_EbmlMaster).Checksum.super_EbmlBinary.super_EbmlElement.
               ElementPosition + 4) = 0;
      *(undefined2 *)&(this_00->super_EbmlMaster).Checksum.super_EbmlBinary.Data = 0x101;
      *(undefined1 *)((long)&(this_00->super_EbmlMaster).Checksum.super_EbmlBinary.Data + 2) = 0;
      (this_00->super_EbmlMaster).super_EbmlElement._vptr_EbmlElement =
           (_func_int **)&PTR__KaxInternalBlock_001ce678;
      (this->Block).group = this_00;
      *(KaxCluster **)
       &(this_00->super_EbmlMaster).Checksum.super_EbmlBinary.super_EbmlElement.bValueIsSet =
           this->ParentCluster;
    }
    bVar1 = KaxInternalBlock::AddFrame
                      ((KaxInternalBlock *)this_00,track,timecode,buffer,lacing,false);
    if (PastBlock == (KaxBlockBlob *)0x0 && ForwBlock == (KaxBlockBlob *)0x0) {
      *(undefined1 *)
       ((long)&(((this->Block).group)->super_EbmlMaster).Checksum.super_EbmlBinary.Data + 1) = 1;
    }
    else {
      *(undefined1 *)
       ((long)&(((this->Block).group)->super_EbmlMaster).Checksum.super_EbmlBinary.Data + 1) = 0;
      if (((ForwBlock != (KaxBlockBlob *)0x0) &&
          (pKVar2 = operator_cast_to_KaxInternalBlock_(ForwBlock), timecode < pKVar2->Timecode)) ||
         ((PastBlock != (KaxBlockBlob *)0x0 &&
          (pKVar2 = operator_cast_to_KaxInternalBlock_(PastBlock), timecode < pKVar2->Timecode)))) {
        *(undefined1 *)
         ((long)&(((this->Block).group)->super_EbmlMaster).Checksum.super_EbmlBinary.Data + 2) = 1;
        return bVar1;
      }
    }
    *(undefined1 *)
     ((long)&(((this->Block).group)->super_EbmlMaster).Checksum.super_EbmlBinary.Data + 2) = 0;
  }
  else {
    bVar1 = ReplaceSimpleByGroup(this);
    if (bVar1) {
      bVar1 = KaxBlockGroup::AddFrame
                        ((this->Block).group,track,timecode,buffer,PastBlock,ForwBlock,lacing);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool KaxBlockBlob::AddFrameAuto(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, LacingType lacing, const KaxBlockBlob * PastBlock, const KaxBlockBlob * ForwBlock)
{
  bool bResult = false;
#if MATROSKA_VERSION >= 2
  if ((SimpleBlockMode == BLOCK_BLOB_ALWAYS_SIMPLE) || (SimpleBlockMode == BLOCK_BLOB_SIMPLE_AUTO && PastBlock == NULL && ForwBlock == NULL)) {
    assert(bUseSimpleBlock == true);
    if (Block.simpleblock == NULL) {
      Block.simpleblock = new KaxSimpleBlock();
      Block.simpleblock->SetParent(*ParentCluster);
    }

    bResult = Block.simpleblock->AddFrame(track, timecode, buffer, lacing);
    if (PastBlock == NULL && ForwBlock == NULL) {
      Block.simpleblock->SetKeyframe(true);
      Block.simpleblock->SetDiscardable(false);
    } else {
      Block.simpleblock->SetKeyframe(false);
      if ((ForwBlock == NULL || ((const KaxInternalBlock &)*ForwBlock).GlobalTimecode() <= timecode) &&
          (PastBlock == NULL || ((const KaxInternalBlock &)*PastBlock).GlobalTimecode() <= timecode))
        Block.simpleblock->SetDiscardable(false);
      else
        Block.simpleblock->SetDiscardable(true);
    }
  }
  else
#endif
    if (ReplaceSimpleByGroup())
      bResult = Block.group->AddFrame(track, timecode, buffer, PastBlock, ForwBlock, lacing);

  return bResult;
}